

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O1

void sei_free(sei_t *sei)

{
  _sei_message_t *p_Var1;
  sei_message_t *__ptr;
  
  __ptr = sei->head;
  while (__ptr != (sei_message_t *)0x0) {
    p_Var1 = __ptr->next;
    free(__ptr);
    sei->head = p_Var1;
    __ptr = p_Var1;
  }
  sei->timestamp = 0.0;
  sei->head = (sei_message_t *)0x0;
  sei->tail = (sei_message_t *)0x0;
  return;
}

Assistant:

void sei_free(sei_t* sei)
{
    sei_message_t* tail;

    while (sei->head) {
        tail = sei->head->next;
        free(sei->head);
        sei->head = tail;
    }

    sei_init(sei, 0);
}